

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Query_PDU::Decode
          (Minefield_Query_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  ushort local_6c;
  unsigned_short local_6a;
  undefined1 local_68 [4];
  KUINT16 j;
  KUINT16 ui16Tmp;
  byte local_56;
  undefined1 local_55;
  KUINT8 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Minefield_Query_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x28) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ::clear(&this->m_vPoints);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->m_vui16SensorTypes);
  Minefield_Header::Decode(&this->super_Minefield_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_ReqID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8ReqID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8NumPerimPoints);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Padding1);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8NumSensTyp);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_DataFilter).super_DataTypeBase);
  DATA_TYPE::operator>>(pKVar2,&(this->m_MineTypFilter).super_DataTypeBase);
  for (local_56 = 0; local_56 < this->m_ui8NumPerimPoints; local_56 = local_56 + 1) {
    DATA_TYPE::PerimeterPointCoordinate::PerimeterPointCoordinate
              ((PerimeterPointCoordinate *)local_68,pKStack_18);
    std::
    vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
    ::push_back(&this->m_vPoints,(PerimeterPointCoordinate *)local_68);
    DATA_TYPE::PerimeterPointCoordinate::~PerimeterPointCoordinate
              ((PerimeterPointCoordinate *)local_68);
  }
  local_6a = 0;
  for (local_6c = 0; local_6c < this->m_ui8NumSensTyp; local_6c = local_6c + 1) {
    KDataStream::operator>>(pKStack_18,&local_6a);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->m_vui16SensorTypes,&local_6a);
  }
  calcPadding(this);
  if ((this->m_bNeedsPadding & 1U) != 0) {
    KDataStream::operator>>(pKStack_18,&this->m_ui16Padding1);
  }
  return;
}

Assistant:

void Minefield_Query_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < MINEFIELD_QUERY_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vPoints.clear();
    m_vui16SensorTypes.clear();

    Minefield_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_ReqID
           >> m_ui8ReqID
           >> m_ui8NumPerimPoints
           >> m_ui8Padding1
           >> m_ui8NumSensTyp
           >> KDIS_STREAM m_DataFilter
           >> KDIS_STREAM m_MineTypFilter;

    for( KUINT8 i = 0; i < m_ui8NumPerimPoints; ++i )
    {
        m_vPoints.push_back( PerimeterPointCoordinate( stream ) );
    }

    KUINT16 ui16Tmp = 0;
    for( KUINT16 j = 0; j < m_ui8NumSensTyp; ++j )
    {
        stream >> ui16Tmp;
        m_vui16SensorTypes.push_back( ui16Tmp );
    }

    // Does the PDU contain padding?
    calcPadding();
    if( m_bNeedsPadding )
    {
        stream >> m_ui16Padding1;
    }
}